

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

iterator __thiscall
ft::vector<int,_ft::allocator<int>_>::erase
          (vector<int,_ft::allocator<int>_> *this,iterator first,iterator last)

{
  void *__dest;
  size_type sVar1;
  iterator piVar2;
  size_t __n;
  iterator piVar3;
  size_t sVar4;
  
  piVar3 = this->m_data + this->m_size;
  __dest = operator_new((long)piVar3 - (long)last);
  __n = (long)piVar3 - (long)last;
  if (__n != 0) {
    memcpy(__dest,last,__n);
  }
  sVar1 = this->m_size;
  piVar2 = this->m_data + sVar1;
  if (piVar2 != first) {
    do {
      sVar1 = sVar1 - 1;
      piVar2 = piVar2 + -1;
    } while (piVar2 != first);
    this->m_size = sVar1;
  }
  if (piVar3 != last) {
    sVar4 = 0;
    do {
      push_back(this,(value_type_conflict *)((long)__dest + sVar4));
      sVar4 = sVar4 + 4;
    } while (__n != sVar4);
  }
  operator_delete(__dest);
  return first;
}

Assistant:

iterator    erase(iterator first, iterator last) {
		vector	tmp(last, this->end());
		while (first != this->end())
			this->pop_back();
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
		return first;
	}